

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu_absolute_instructions.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_887c0::CpuAbsoluteTest::run_write_instruction
          (CpuAbsoluteTest *this,uint8_t instruction)

{
  uint16_t uVar1;
  ushort uVar2;
  code *pcVar3;
  bool bVar4;
  MockSpec<unsigned_char_(unsigned_short)> *pMVar5;
  TypedExpectation<unsigned_char_(unsigned_short)> *pTVar6;
  MockSpec<void_(unsigned_short,_unsigned_char)> *this_00;
  char *message;
  AssertHelper local_190;
  Message local_188;
  undefined1 local_180 [8];
  AssertionResult gtest_ar;
  Matcher<unsigned_char> local_168;
  Matcher<unsigned_short> local_150;
  MockSpec<void_(unsigned_short,_unsigned_char)> local_138;
  ReturnAction<unsigned_char> local_100;
  Action<unsigned_char_(unsigned_short)> local_f0;
  WithoutMatchers local_c9;
  Matcher<unsigned_short> local_c8;
  MockSpec<unsigned_char_(unsigned_short)> local_b0;
  ReturnAction<unsigned_char> local_90;
  Action<unsigned_char_(unsigned_short)> local_80;
  WithoutMatchers local_5d [13];
  Matcher<unsigned_short> local_50;
  MockSpec<unsigned_char_(unsigned_short)> local_38;
  uchar local_13;
  uchar local_12;
  uint8_t local_11;
  uint8_t upper_address;
  uint8_t lower_address;
  CpuAbsoluteTest *pCStack_10;
  uint8_t instruction_local;
  CpuAbsoluteTest *this_local;
  
  uVar1 = *(uint16_t *)&(this->super_CpuTest).field_0x112;
  (this->super_CpuTest).expected.pc = uVar1;
  (this->super_CpuTest).registers.pc = uVar1;
  local_11 = instruction;
  pCStack_10 = this;
  n_e_s::core::test::CpuTest::stage_instruction(&this->super_CpuTest,instruction);
  uVar2 = (this->super_CpuTest).expected.pc;
  if (SCARRY4((uint)uVar2,2)) {
    pcVar3 = (code *)invalidInstructionException();
    (*pcVar3)();
  }
  (this->super_CpuTest).expected.pc = uVar2 + 2;
  local_12 = (uchar)*(undefined2 *)&(this->super_CpuTest).field_0x116;
  local_13 = (uchar)((ushort)*(undefined2 *)&(this->super_CpuTest).field_0x116 >> 8);
  uVar2 = *(ushort *)&(this->super_CpuTest).field_0x112;
  if (!SCARRY4((uint)uVar2,1)) {
    testing::Matcher<unsigned_short>::Matcher(&local_50,uVar2 + 1);
    n_e_s::core::test::MockMmu::gmock_read_byte
              (&local_38,&(this->super_CpuTest).mmu.super_MockMmu,&local_50);
    testing::internal::GetWithoutMatchers();
    pMVar5 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::operator()
                       (&local_38,local_5d,(void *)0x0);
    pTVar6 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                       (pMVar5,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_cpu_absolute_instructions.cpp"
                        ,0x2e,"mmu","read_byte(start_pc + 1)");
    testing::Return<unsigned_char>((testing *)&local_90,local_12);
    testing::internal::ReturnAction::operator_cast_to_Action(&local_80,(ReturnAction *)&local_90);
    testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce(pTVar6,&local_80);
    testing::Action<unsigned_char_(unsigned_short)>::~Action(&local_80);
    testing::internal::ReturnAction<unsigned_char>::~ReturnAction(&local_90);
    testing::internal::MockSpec<unsigned_char_(unsigned_short)>::~MockSpec(&local_38);
    testing::Matcher<unsigned_short>::~Matcher(&local_50);
    uVar2 = *(ushort *)&(this->super_CpuTest).field_0x112;
    if (!SCARRY4((uint)uVar2,2)) {
      testing::Matcher<unsigned_short>::Matcher(&local_c8,uVar2 + 2);
      n_e_s::core::test::MockMmu::gmock_read_byte
                (&local_b0,&(this->super_CpuTest).mmu.super_MockMmu,&local_c8);
      testing::internal::GetWithoutMatchers();
      pMVar5 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::operator()
                         (&local_b0,&local_c9,(void *)0x0);
      pTVar6 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                         (pMVar5,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_cpu_absolute_instructions.cpp"
                          ,0x30,"mmu","read_byte(start_pc + 2)");
      testing::Return<unsigned_char>((testing *)&local_100,local_13);
      testing::internal::ReturnAction::operator_cast_to_Action(&local_f0,(ReturnAction *)&local_100)
      ;
      testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce
                (pTVar6,&local_f0);
      testing::Action<unsigned_char_(unsigned_short)>::~Action(&local_f0);
      testing::internal::ReturnAction<unsigned_char>::~ReturnAction(&local_100);
      testing::internal::MockSpec<unsigned_char_(unsigned_short)>::~MockSpec(&local_b0);
      testing::Matcher<unsigned_short>::~Matcher(&local_c8);
      testing::Matcher<unsigned_short>::Matcher
                (&local_150,*(unsigned_short *)&(this->super_CpuTest).field_0x116);
      testing::Matcher<unsigned_char>::Matcher(&local_168,(this->super_CpuTest).field_0x114);
      n_e_s::core::test::MockMmu::gmock_write_byte
                (&local_138,&(this->super_CpuTest).mmu.super_MockMmu,&local_150,&local_168);
      testing::internal::GetWithoutMatchers();
      this_00 = testing::internal::MockSpec<void_(unsigned_short,_unsigned_char)>::operator()
                          (&local_138,
                           (WithoutMatchers *)
                           ((long)&gtest_ar.message_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           + 7),(void *)0x0);
      testing::internal::MockSpec<void_(unsigned_short,_unsigned_char)>::InternalExpectedAt
                (this_00,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_cpu_absolute_instructions.cpp"
                 ,0x32,"mmu","write_byte(effective_address, memory_content)");
      testing::internal::MockSpec<void_(unsigned_short,_unsigned_char)>::~MockSpec(&local_138);
      testing::Matcher<unsigned_char>::~Matcher(&local_168);
      testing::Matcher<unsigned_short>::~Matcher(&local_150);
      n_e_s::core::test::CpuTest::step_execution(&this->super_CpuTest,'\x04');
      testing::internal::EqHelper::
      Compare<n_e_s::core::CpuRegisters,_n_e_s::core::CpuRegisters,_nullptr>
                ((EqHelper *)local_180,"expected","registers",&(this->super_CpuTest).expected,
                 &(this->super_CpuTest).registers);
      bVar4 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_180);
      if (!bVar4) {
        testing::Message::Message(&local_188);
        message = testing::AssertionResult::failure_message((AssertionResult *)local_180);
        testing::internal::AssertHelper::AssertHelper
                  (&local_190,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_cpu_absolute_instructions.cpp"
                   ,0x35,message);
        testing::internal::AssertHelper::operator=(&local_190,&local_188);
        testing::internal::AssertHelper::~AssertHelper(&local_190);
        testing::Message::~Message(&local_188);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_180);
      return;
    }
    pcVar3 = (code *)invalidInstructionException();
    (*pcVar3)();
  }
  pcVar3 = (code *)invalidInstructionException();
  (*pcVar3)();
}

Assistant:

void run_write_instruction(uint8_t instruction) {
        registers.pc = expected.pc = start_pc;
        stage_instruction(instruction);
        expected.pc += 2;

        const auto lower_address = static_cast<uint8_t>(
                effective_address & static_cast<uint16_t>(0x00FFu));
        const auto upper_address =
                static_cast<uint8_t>((effective_address & 0xFF00u) >> 8u);

        EXPECT_CALL(mmu, read_byte(start_pc + 1))
                .WillOnce(Return(lower_address));
        EXPECT_CALL(mmu, read_byte(start_pc + 2))
                .WillOnce(Return(upper_address));
        EXPECT_CALL(mmu, write_byte(effective_address, memory_content));

        step_execution(4);
        EXPECT_EQ(expected, registers);
    }